

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>
          (ParamsWrapper<CNetAddr::SerParams,_CService> *this,VectorWriter *s)

{
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *in_RSI;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> ss;
  VectorWriter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams>::ParamsStream
            (in_RSI,&local_18,(SerParams *)in_RDI);
  Serialize<ParamsStream<VectorWriter_&,_CNetAddr::SerParams>,_CService>
            (in_RDI,(CService *)0x312b52);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        ParamsStream ss{s, m_params};
        ::Serialize(ss, m_object);
    }